

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_insert_pointer_Test::~IntrusiveListTest_insert_pointer_Test
          (IntrusiveListTest_insert_pointer_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, insert_pointer) {
  TestObjectList list;

  list.insert(list.begin(), std::make_unique<TestObject>(2));
  list.insert(list.end(), std::make_unique<TestObject>(4));
  list.insert(std::next(list.begin()), std::make_unique<TestObject>(3));
  list.insert(list.begin(), std::make_unique<TestObject>(1));

  AssertListEq(list, {1, 2, 3, 4});
}